

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::variable_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *variable)

{
  uint id;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  SPIRType *type;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  type = Compiler::get_variable_data_type(&this->super_Compiler,variable);
  if ((1 < type->pointer_depth) && ((this->backend).support_pointer_to_pointer == false)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot declare pointer-to-pointer types.");
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x32])
            (&local_90,this,(ulong)(variable->super_IVariant).self.id);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&local_50,this,(ulong)(variable->super_IVariant).self.id,1);
  pbVar4 = &local_50;
  (*(this->super_Compiler)._vptr_Compiler[0x1b])
            (&local_70,this,type,pbVar4,(ulong)(variable->super_IVariant).self.id);
  join<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_90,&local_70,pbVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (variable->loop_variable == true) {
    id = (variable->static_expression).id;
    if ((ulong)id != 0) {
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
          TypeUndef) {
        if ((this->options).force_zero_initialized_variables != true) {
          return __return_storage_ptr__;
        }
        bVar1 = type_can_zero_initialize(this,type);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        uVar2 = Compiler::get_variable_data_type_id(&this->super_Compiler,variable);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this->super_Compiler)._vptr_Compiler;
        (*(code *)pbVar4[0xe].field_2._M_allocated_capacity)(&local_70,this,uVar2);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_90,(spirv_cross *)0x303a1d,(char (*) [4])&local_70,pbVar4);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      }
      else {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
        to_unpacked_expression_abi_cxx11_(&local_70,this,id,true);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_90,(spirv_cross *)0x303a1d,(char (*) [4])&local_70,pbVar4);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      }
      goto LAB_0028ec08;
    }
  }
  if ((variable->initializer).id == 0) {
    return __return_storage_ptr__;
  }
  iVar3 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,variable,4);
  if ((char)iVar3 != '\0') {
    return __return_storage_ptr__;
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (*(int *)((long)&pbVar4->field_2 + (ulong)(variable->initializer).id * 0x18) == 0xc) {
    if ((this->options).force_zero_initialized_variables != true) {
      return __return_storage_ptr__;
    }
    bVar1 = type_can_zero_initialize(this,type);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    uVar2 = Compiler::get_variable_data_type_id(&this->super_Compiler,variable);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->super_Compiler)._vptr_Compiler;
    (*(code *)pbVar4[0xe].field_2._M_allocated_capacity)(&local_70,this,uVar2);
    join<char_const(&)[4],std::__cxx11::string>
              (&local_90,(spirv_cross *)0x303a1d,(char (*) [4])&local_70,pbVar4);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x39])(&local_70,this,variable);
    join<char_const(&)[4],std::__cxx11::string>
              (&local_90,(spirv_cross *)0x303a1d,(char (*) [4])&local_70,pbVar4);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
  }
LAB_0028ec08:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRVariable &variable)
{
	// Ignore the pointer type since GLSL doesn't have pointers.
	auto &type = get_variable_data_type(variable);

	if (type.pointer_depth > 1 && !backend.support_pointer_to_pointer)
		SPIRV_CROSS_THROW("Cannot declare pointer-to-pointer types.");

	auto res = join(to_qualifiers_glsl(variable.self), variable_decl(type, to_name(variable.self), variable.self));

	if (variable.loop_variable && variable.static_expression)
	{
		uint32_t expr = variable.static_expression;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_unpacked_expression(variable.static_expression));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}
	else if (variable.initializer && !variable_decl_is_remapped_storage(variable, StorageClassWorkgroup))
	{
		uint32_t expr = variable.initializer;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_initializer_expression(variable));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}

	return res;
}